

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.h
# Opt level: O0

int __thiscall
Acceptor<Client>::accept(Acceptor<Client> *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int socket;
  undefined8 uVar1;
  undefined4 in_register_00000034;
  long lVar2;
  int new_socket;
  string *description;
  AcceptException *this_00;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  this_00 = (AcceptException *)this;
  socket = ::accept(*(int *)(lVar2 + 8),(sockaddr *)(lVar2 + 0x10),(socklen_t *)(lVar2 + 0xc));
  if (socket < 0) {
    uVar1 = __cxa_allocate_exception(0x28);
    description = (string *)&stack0xffffffffffffffc7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    AcceptException::AcceptException(this_00,description);
    __cxa_throw(uVar1,&AcceptException::typeinfo,AcceptException::~AcceptException);
  }
  Client::Client((Client *)this_00,socket);
  return (int)this;
}

Assistant:

T Acceptor<T>::accept() { 
    int new_socket;
    if ((new_socket = ::accept(server_fd, (sockaddr *)&address,  
                       (socklen_t*)&addrlen))<0) { 
        throw AcceptException("Accept");
    } 

    return T(new_socket);
}